

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
FIX::Session::nextResendRequest(Session *this,Message *resendRequest,UtcTimeStamp *now)

{
  bool bVar1;
  uint uVar2;
  BeginSeqNo *pBVar3;
  EndSeqNo *pEVar4;
  IntTConvertor<unsigned_long> *pIVar5;
  StringField *this_00;
  string *psVar6;
  uint64_t uVar7;
  SEQNUM SVar8;
  uint64_t uVar9;
  FieldMap *this_01;
  unsigned_long value;
  unsigned_long value_00;
  uchar *in_R8;
  size_t in_R9;
  undefined1 local_310 [8];
  MsgSeqNum msgSeqNum;
  SEQNUM next;
  EndSeqNo local_200;
  undefined1 local_1a8 [8];
  string beginString;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  EndSeqNo endSeqNo;
  undefined1 local_80 [8];
  BeginSeqNo beginSeqNo;
  Locker l;
  UtcTimeStamp *now_local;
  Message *resendRequest_local;
  Session *this_local;
  
  uVar2 = verify(this,(EVP_PKEY_CTX *)resendRequest,(uchar *)0x0,0,in_R8,in_R9);
  if ((uVar2 & 1) == 0) {
    return;
  }
  Locker::Locker((Locker *)&beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics,&this->m_mutex);
  pBVar3 = FieldMap::getField<FIX::BeginSeqNo>(&resendRequest->super_FieldMap);
  BeginSeqNo::BeginSeqNo((BeginSeqNo *)local_80,pBVar3);
  pEVar4 = FieldMap::getField<FIX::EndSeqNo>(&resendRequest->super_FieldMap);
  EndSeqNo::EndSeqNo((EndSeqNo *)local_e8,pEVar4);
  pIVar5 = (IntTConvertor<unsigned_long> *)
           UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_80);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_168,pIVar5,value);
  std::operator+(&local_148,"Received ResendRequest FROM: ",&local_168);
  std::operator+(&local_128,&local_148," TO: ");
  pIVar5 = (IntTConvertor<unsigned_long> *)
           UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_
            ((string *)((long)&beginString.field_2 + 8),pIVar5,value_00);
  std::operator+(&local_108,&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&beginString.field_2 + 8));
  SessionState::onEvent(&this->m_state,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)(beginString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  this_00 = &SessionID::getBeginString(&this->m_sessionID)->super_StringField;
  psVar6 = StringField::operator_cast_to_string_(this_00);
  std::__cxx11::string::string((string *)local_1a8,(string *)psVar6);
  bVar1 = std::operator>=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1a8,"FIX.4.2");
  if (((!bVar1) ||
      (uVar7 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8), uVar7 != 0)) &&
     ((bVar1 = std::operator<=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a8,"FIX.4.2"), !bVar1 ||
      (uVar7 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8), uVar7 != 999999
      )))) {
    uVar7 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
    SVar8 = getExpectedSenderNum(this);
    if (uVar7 < SVar8) goto LAB_002a2867;
  }
  SVar8 = getExpectedSenderNum(this);
  EndSeqNo::EndSeqNo(&local_200,SVar8 - 1);
  EndSeqNo::operator=((EndSeqNo *)local_e8,&local_200);
  EndSeqNo::~EndSeqNo(&local_200);
LAB_002a2867:
  if ((this->m_persistMessages & 1U) == 0) {
    uVar7 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
    EndSeqNo::EndSeqNo((EndSeqNo *)&next,uVar7 + 1);
    EndSeqNo::operator=((EndSeqNo *)local_e8,(EndSeqNo *)&next);
    EndSeqNo::~EndSeqNo((EndSeqNo *)&next);
    SVar8 = SessionState::getNextSenderMsgSeqNum(&this->m_state);
    uVar7 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
    if (SVar8 < uVar7) {
      EndSeqNo::EndSeqNo((EndSeqNo *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics,SVar8);
      EndSeqNo::operator=((EndSeqNo *)local_e8,
                          (EndSeqNo *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
      EndSeqNo::~EndSeqNo((EndSeqNo *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
    }
    uVar7 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_80);
    uVar9 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
    generateSequenceReset(this,uVar7,uVar9);
  }
  else {
    uVar7 = UInt64Field::getValue((UInt64Field *)local_80);
    uVar9 = UInt64Field::getValue((UInt64Field *)local_e8);
    generateRetransmits(this,uVar7,uVar9);
  }
  MsgSeqNum::MsgSeqNum((MsgSeqNum *)local_310,0);
  this_01 = &Message::getHeader(resendRequest)->super_FieldMap;
  FieldMap::getField(this_01,(FieldBase *)local_310);
  bVar1 = isTargetTooHigh(this,(MsgSeqNum *)local_310);
  if ((!bVar1) && (bVar1 = isTargetTooLow(this,(MsgSeqNum *)local_310), !bVar1)) {
    SessionState::incrNextTargetMsgSeqNum(&this->m_state);
  }
  MsgSeqNum::~MsgSeqNum((MsgSeqNum *)local_310);
  std::__cxx11::string::~string((string *)local_1a8);
  EndSeqNo::~EndSeqNo((EndSeqNo *)local_e8);
  BeginSeqNo::~BeginSeqNo((BeginSeqNo *)local_80);
  Locker::~Locker((Locker *)&beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics);
  return;
}

Assistant:

void Session::nextResendRequest(const Message &resendRequest, const UtcTimeStamp &now) {
  if (!verify(resendRequest, false, false)) {
    return;
  }

  Locker l(m_mutex);

  auto beginSeqNo = resendRequest.getField<BeginSeqNo>();
  auto endSeqNo = resendRequest.getField<EndSeqNo>();

  m_state.onEvent(
      "Received ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(beginSeqNo)
      + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

  std::string beginString = m_sessionID.getBeginString();
  if ((beginString >= FIX::BeginString_FIX42 && endSeqNo == 0)
      || (beginString <= FIX::BeginString_FIX42 && endSeqNo == 999999) || (endSeqNo >= getExpectedSenderNum())) {
    endSeqNo = getExpectedSenderNum() - 1;
  }

  if (!m_persistMessages) {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    auto next = m_state.getNextSenderMsgSeqNum();
    if (endSeqNo > next) {
      endSeqNo = EndSeqNo(next);
    }
    generateSequenceReset(beginSeqNo, endSeqNo);
  } else {
    generateRetransmits(beginSeqNo.getValue(), endSeqNo.getValue());
  }

  MsgSeqNum msgSeqNum(0);
  resendRequest.getHeader().getField(msgSeqNum);
  if (!isTargetTooHigh(msgSeqNum) && !isTargetTooLow(msgSeqNum)) {
    m_state.incrNextTargetMsgSeqNum();
  }
}